

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglColorClearCase.cpp
# Opt level: O3

ClearOp * deqp::egl::computeRandomClear
                    (ClearOp *__return_storage_ptr__,Random *rnd,int width,int height)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  
  dVar1 = deRandom_getUint32(&rnd->m_rnd);
  dVar2 = deRandom_getUint32(&rnd->m_rnd);
  dVar3 = deRandom_getUint32(&rnd->m_rnd);
  dVar4 = deRandom_getUint32(&rnd->m_rnd);
  dVar5 = deRandom_getUint32(&rnd->m_rnd);
  __return_storage_ptr__->x = dVar3 % (width - dVar1 % (uint)width);
  __return_storage_ptr__->y = dVar4 % (height - dVar2 % (uint)height);
  __return_storage_ptr__->width = dVar1 % (uint)width + 1;
  __return_storage_ptr__->height = dVar2 % (uint)height + 1;
  (__return_storage_ptr__->color).m_value = dVar5;
  return (ClearOp *)CONCAT44(extraout_var,dVar5);
}

Assistant:

static ClearOp computeRandomClear (de::Random& rnd, int width, int height)
{
	int			w		= rnd.getInt(1, width);
	int			h		= rnd.getInt(1, height);
	int			x		= rnd.getInt(0, width-w);
	int			y		= rnd.getInt(0, height-h);
	tcu::RGBA	col		(rnd.getUint32());

	return ClearOp(x, y, w, h, col);
}